

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

void __thiscall QtMWidgets::Stepper::setValue(Stepper *this,int val)

{
  int iVar1;
  int iVar2;
  StepperPrivate *pSVar3;
  int old;
  int val_local;
  Stepper *this_local;
  
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  iVar1 = pSVar3->value;
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  iVar2 = StepperPrivate::bound(pSVar3,val);
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  pSVar3->value = iVar2;
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  StepperPrivate::enableButtons(pSVar3);
  pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
           ::operator->(&this->d);
  if (iVar1 != pSVar3->value) {
    pSVar3 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    valueChanged(this,pSVar3->value);
  }
  return;
}

Assistant:

void
Stepper::setValue( int val )
{
	const int old = d->value;

	d->value = d->bound( val );

	d->enableButtons();

	if( old != d->value )
		emit valueChanged( d->value );
}